

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_94e0e::PercentTotalKernel::aggregate
          (PercentTotalKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  pointer pEVar1;
  Node *pNVar2;
  Config *pCVar3;
  bool bVar4;
  Attribute AVar5;
  cali_id_t cVar6;
  cali_id_t cVar7;
  Entry *e;
  pointer pEVar8;
  double dVar9;
  cali_id_t local_70;
  Attribute sum_attr;
  Variant local_48;
  Attribute local_38;
  
  AVar5 = Config::get_target_attr(this->m_config,db);
  sum_attr.m_node = (Node *)0x0;
  bVar4 = Config::get_percentage_attribute(this->m_config,db,&local_38,&sum_attr);
  if (bVar4) {
    cVar7 = 0xffffffffffffffff;
    if (AVar5.m_node != (Node *)0x0) {
      cVar7 = (AVar5.m_node)->m_id;
    }
    local_70 = 0xffffffffffffffff;
    if (sum_attr.m_node != (Node *)0x0) {
      local_70 = (sum_attr.m_node)->m_id;
    }
    pEVar1 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pEVar8 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
                  super__Vector_impl_data._M_start; pEVar8 != pEVar1; pEVar8 = pEVar8 + 1) {
      pNVar2 = pEVar8->m_node;
      cVar6 = 0xffffffffffffffff;
      if ((pNVar2 != (Node *)0x0) && (cVar6 = pNVar2->m_attribute, cVar6 == 8)) {
        cVar6 = pNVar2->m_id;
      }
      if ((cVar6 == cVar7) || (cVar6 == local_70)) {
        local_48.m_v.type_and_size = (pEVar8->m_value).m_v.type_and_size;
        local_48.m_v.value = (pEVar8->m_value).m_v.value;
        dVar9 = cali::Variant::to_double(&local_48,(bool *)0x0);
        this->m_sum = dVar9 + this->m_sum;
        this->m_isum = dVar9 + this->m_isum;
        pCVar3 = this->m_config;
        std::mutex::lock(&pCVar3->m_total_lock);
        pCVar3->m_total = dVar9 + pCVar3->m_total;
        pthread_mutex_unlock((pthread_mutex_t *)&pCVar3->m_total_lock);
      }
    }
  }
  return;
}

Assistant:

void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        Attribute target_attr = m_config->get_target_attr(db);
        Attribute percentage_attr, sum_attr;

        if (!m_config->get_percentage_attribute(db, percentage_attr, sum_attr))
            return;

        cali_id_t target_id = target_attr.id();
        cali_id_t sum_id    = sum_attr.id();

        for (const Entry& e : list) {
            cali_id_t id = e.attribute();

            if (id == target_id || id == sum_id) {
                double val = e.value().to_double();
                m_sum += val;
                m_isum += val;
                m_config->add(val);
            }
        }
    }